

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publickey.c
# Opt level: O0

int libssh2_publickey_list_fetch
              (LIBSSH2_PUBLICKEY *pkey,unsigned_long *num_keys,libssh2_publickey_list **pkey_list)

{
  LIBSSH2_CHANNEL *channel_00;
  LIBSSH2_SESSION *session_00;
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ssize_t sVar4;
  ulong uVar5;
  void *pvVar6;
  void *local_a8;
  unsigned_long comment_len;
  libssh2_publickey_list *newlist;
  unsigned_long lang_len;
  unsigned_long descr_len;
  unsigned_long status;
  ssize_t nwritten;
  int rc;
  int response;
  unsigned_long i;
  unsigned_long max_keys;
  unsigned_long keys;
  unsigned_long buffer_len;
  libssh2_publickey_list *list;
  LIBSSH2_SESSION *session;
  LIBSSH2_CHANNEL *channel;
  libssh2_publickey_list **pkey_list_local;
  unsigned_long *num_keys_local;
  LIBSSH2_PUBLICKEY *pkey_local;
  
  buffer_len = 0;
  max_keys = 0;
  i = 0;
  if (pkey == (LIBSSH2_PUBLICKEY *)0x0) {
    return -0x27;
  }
  channel_00 = pkey->channel;
  session_00 = channel_00->session;
  if (pkey->listFetch_state == libssh2_NB_state_idle) {
    pkey->listFetch_data = (uchar *)0x0;
    pkey->listFetch_s = pkey->listFetch_buffer;
    _libssh2_htonu32(pkey->listFetch_s,8);
    pkey->listFetch_s = pkey->listFetch_s + 4;
    _libssh2_htonu32(pkey->listFetch_s,4);
    pkey->listFetch_s = pkey->listFetch_s + 4;
    builtin_memcpy(pkey->listFetch_s,"list",4);
    pkey->listFetch_s = pkey->listFetch_s + 4;
    pkey->listFetch_state = libssh2_NB_state_created;
  }
  if (pkey->listFetch_state == libssh2_NB_state_created) {
    sVar4 = _libssh2_channel_write
                      (channel_00,0,pkey->listFetch_buffer,
                       (long)pkey->listFetch_s - (long)pkey->listFetch_buffer);
    if (sVar4 == -0x25) {
      return -0x25;
    }
    if ((long)pkey->listFetch_s - (long)pkey->listFetch_buffer != sVar4) {
      pkey->listFetch_state = libssh2_NB_state_idle;
      iVar1 = _libssh2_error(session_00,-7,"Unable to send publickey list packet");
      return iVar1;
    }
    pkey->listFetch_state = libssh2_NB_state_sent;
  }
  while( true ) {
    iVar1 = publickey_packet_receive(pkey,&pkey->listFetch_data,&pkey->listFetch_data_len);
    if (iVar1 == -0x25) {
      return -0x25;
    }
    if (iVar1 != 0) break;
    pkey->listFetch_s = pkey->listFetch_data;
    iVar1 = publickey_response_id(&pkey->listFetch_s,pkey->listFetch_data_len);
    if (iVar1 < 0) {
      _libssh2_error(session_00,-0x24,"Invalid publickey subsystem response code");
      goto LAB_0012fd03;
    }
    if (iVar1 == 0) {
      if (pkey->listFetch_data + pkey->listFetch_data_len < pkey->listFetch_s + 8) {
        _libssh2_error(session_00,-0x26,"ListFetch data too short");
      }
      else {
        uVar3 = _libssh2_ntohu32(pkey->listFetch_s);
        pkey->listFetch_s = pkey->listFetch_s + 4;
        uVar2 = _libssh2_ntohu32(pkey->listFetch_s);
        pkey->listFetch_s = pkey->listFetch_s + 4;
        if (pkey->listFetch_data + pkey->listFetch_data_len < pkey->listFetch_s + (ulong)uVar2 + 4)
        {
          _libssh2_error(session_00,-0x26,"ListFetch data too short");
        }
        else {
          pkey->listFetch_s = pkey->listFetch_s + uVar2;
          uVar2 = _libssh2_ntohu32(pkey->listFetch_s);
          pkey->listFetch_s = pkey->listFetch_s + 4;
          if (pkey->listFetch_data + pkey->listFetch_data_len < pkey->listFetch_s + uVar2) {
            _libssh2_error(session_00,-0x26,"ListFetch data too short");
          }
          else {
            pkey->listFetch_s = pkey->listFetch_s + uVar2;
            if (pkey->listFetch_data + pkey->listFetch_data_len < pkey->listFetch_s) {
              _libssh2_error(session_00,-0x24,"Malformed publickey subsystem packet");
            }
            else {
              if ((ulong)uVar3 == 0) {
                (*session_00->free)(pkey->listFetch_data,&session_00->abstract);
                pkey->listFetch_data = (uchar *)0x0;
                *pkey_list = (libssh2_publickey_list *)buffer_len;
                *num_keys = max_keys;
                pkey->listFetch_state = libssh2_NB_state_idle;
                return 0;
              }
              publickey_status_error(pkey,session_00,(ulong)uVar3);
            }
          }
        }
      }
      goto LAB_0012fd03;
    }
    if (iVar1 == 2) {
      if (i <= max_keys) {
        if (buffer_len == 0) {
          local_a8 = (*session_00->alloc)((i + 9) * 0x38,&session_00->abstract);
        }
        else {
          local_a8 = (*session_00->realloc)((void *)buffer_len,(i + 9) * 0x38,&session_00->abstract)
          ;
        }
        if (local_a8 == (void *)0x0) {
          _libssh2_error(session_00,-6,"Unable to allocate memory for publickey list");
          goto LAB_0012fd03;
        }
        buffer_len = (unsigned_long)local_a8;
        i = i + 8;
      }
      if (pkey->version == 1) {
        if (pkey->listFetch_data + pkey->listFetch_data_len < pkey->listFetch_s + 4) {
          _libssh2_error(session_00,-0x26,"ListFetch data too short");
          goto LAB_0012fd03;
        }
        uVar3 = _libssh2_ntohu32(pkey->listFetch_s);
        uVar5 = (ulong)uVar3;
        pkey->listFetch_s = pkey->listFetch_s + 4;
        if (uVar5 == 0) {
          *(undefined8 *)(buffer_len + max_keys * 0x38 + 0x28) = 0;
          *(undefined8 *)(buffer_len + max_keys * 0x38 + 0x30) = 0;
        }
        else {
          *(undefined8 *)(buffer_len + max_keys * 0x38 + 0x28) = 1;
          pvVar6 = (*session_00->alloc)(0x28,&session_00->abstract);
          *(void **)(buffer_len + max_keys * 0x38 + 0x30) = pvVar6;
          if (*(long *)(buffer_len + max_keys * 0x38 + 0x30) == 0) {
            _libssh2_error(session_00,-6,"Unable to allocate memory for publickey attributes");
            goto LAB_0012fd03;
          }
          **(undefined8 **)(buffer_len + max_keys * 0x38 + 0x30) = "comment";
          *(undefined8 *)(*(long *)(buffer_len + max_keys * 0x38 + 0x30) + 8) = 7;
          *(uchar **)(*(long *)(buffer_len + max_keys * 0x38 + 0x30) + 0x10) = pkey->listFetch_s;
          *(ulong *)(*(long *)(buffer_len + max_keys * 0x38 + 0x30) + 0x18) = uVar5;
          *(undefined1 *)(*(long *)(buffer_len + max_keys * 0x38 + 0x30) + 0x20) = 0;
          pkey->listFetch_s = pkey->listFetch_s + uVar5;
        }
        if (pkey->listFetch_data + pkey->listFetch_data_len < pkey->listFetch_s + 4) {
          _libssh2_error(session_00,-0x26,"ListFetch data too short");
          goto LAB_0012fd03;
        }
        uVar3 = _libssh2_ntohu32(pkey->listFetch_s);
        *(ulong *)(buffer_len + max_keys * 0x38 + 0x10) = (ulong)uVar3;
        pkey->listFetch_s = pkey->listFetch_s + 4;
        if (pkey->listFetch_data + pkey->listFetch_data_len <
            pkey->listFetch_s + *(long *)(buffer_len + max_keys * 0x38 + 0x10)) {
          _libssh2_error(session_00,-0x26,"ListFetch data too short");
          goto LAB_0012fd03;
        }
        *(uchar **)(buffer_len + max_keys * 0x38 + 8) = pkey->listFetch_s;
        pkey->listFetch_s = pkey->listFetch_s + *(long *)(buffer_len + max_keys * 0x38 + 0x10);
        if (pkey->listFetch_data + pkey->listFetch_data_len < pkey->listFetch_s + 4) {
          _libssh2_error(session_00,-0x26,"ListFetch data too short");
          goto LAB_0012fd03;
        }
        uVar3 = _libssh2_ntohu32(pkey->listFetch_s);
        *(ulong *)(buffer_len + max_keys * 0x38 + 0x20) = (ulong)uVar3;
        pkey->listFetch_s = pkey->listFetch_s + 4;
        if (pkey->listFetch_data + pkey->listFetch_data_len <
            pkey->listFetch_s + *(long *)(buffer_len + max_keys * 0x38 + 0x20)) {
          _libssh2_error(session_00,-0x26,"ListFetch data too short");
          goto LAB_0012fd03;
        }
        *(uchar **)(buffer_len + max_keys * 0x38 + 0x18) = pkey->listFetch_s;
        pkey->listFetch_s = pkey->listFetch_s + *(long *)(buffer_len + max_keys * 0x38 + 0x20);
      }
      else {
        if (pkey->listFetch_data + pkey->listFetch_data_len < pkey->listFetch_s + 4) {
          _libssh2_error(session_00,-0x26,"ListFetch data too short");
          goto LAB_0012fd03;
        }
        uVar3 = _libssh2_ntohu32(pkey->listFetch_s);
        *(ulong *)(buffer_len + max_keys * 0x38 + 0x10) = (ulong)uVar3;
        pkey->listFetch_s = pkey->listFetch_s + 4;
        if (pkey->listFetch_data + pkey->listFetch_data_len <
            pkey->listFetch_s + *(long *)(buffer_len + max_keys * 0x38 + 0x10)) {
          _libssh2_error(session_00,-0x26,"ListFetch data too short");
          goto LAB_0012fd03;
        }
        *(uchar **)(buffer_len + max_keys * 0x38 + 8) = pkey->listFetch_s;
        pkey->listFetch_s = pkey->listFetch_s + *(long *)(buffer_len + max_keys * 0x38 + 0x10);
        if (pkey->listFetch_data + pkey->listFetch_data_len < pkey->listFetch_s + 4) {
          _libssh2_error(session_00,-0x26,"ListFetch data too short");
          goto LAB_0012fd03;
        }
        uVar3 = _libssh2_ntohu32(pkey->listFetch_s);
        *(ulong *)(buffer_len + max_keys * 0x38 + 0x20) = (ulong)uVar3;
        pkey->listFetch_s = pkey->listFetch_s + 4;
        if (pkey->listFetch_data + pkey->listFetch_data_len <
            pkey->listFetch_s + *(long *)(buffer_len + max_keys * 0x38 + 0x20)) {
          _libssh2_error(session_00,-0x26,"ListFetch data too short");
          goto LAB_0012fd03;
        }
        *(uchar **)(buffer_len + max_keys * 0x38 + 0x18) = pkey->listFetch_s;
        pkey->listFetch_s = pkey->listFetch_s + *(long *)(buffer_len + max_keys * 0x38 + 0x20);
        if (pkey->listFetch_data + pkey->listFetch_data_len < pkey->listFetch_s + 4) {
          _libssh2_error(session_00,-0x26,"ListFetch data too short");
          goto LAB_0012fd03;
        }
        uVar3 = _libssh2_ntohu32(pkey->listFetch_s);
        *(ulong *)(buffer_len + max_keys * 0x38 + 0x28) = (ulong)uVar3;
        pkey->listFetch_s = pkey->listFetch_s + 4;
        if (*(long *)(buffer_len + max_keys * 0x38 + 0x28) == 0) {
          *(undefined8 *)(buffer_len + max_keys * 0x38 + 0x30) = 0;
        }
        else {
          pvVar6 = (*session_00->alloc)
                             (*(long *)(buffer_len + max_keys * 0x38 + 0x28) * 0x28,
                              &session_00->abstract);
          *(void **)(buffer_len + max_keys * 0x38 + 0x30) = pvVar6;
          if (*(long *)(buffer_len + max_keys * 0x38 + 0x30) == 0) {
            _libssh2_error(session_00,-6,"Unable to allocate memory for publickey attributes");
            goto LAB_0012fd03;
          }
          for (_rc = 0; _rc < *(ulong *)(buffer_len + max_keys * 0x38 + 0x28); _rc = _rc + 1) {
            if (pkey->listFetch_data + pkey->listFetch_data_len < pkey->listFetch_s + 4) {
              _libssh2_error(session_00,-0x26,"ListFetch data too short");
              goto LAB_0012fd03;
            }
            uVar3 = _libssh2_ntohu32(pkey->listFetch_s);
            *(ulong *)(*(long *)(buffer_len + max_keys * 0x38 + 0x30) + _rc * 0x28 + 8) =
                 (ulong)uVar3;
            pkey->listFetch_s = pkey->listFetch_s + 4;
            if (pkey->listFetch_data + pkey->listFetch_data_len <
                pkey->listFetch_s +
                *(long *)(*(long *)(buffer_len + max_keys * 0x38 + 0x30) + _rc * 0x28 + 8)) {
              _libssh2_error(session_00,-0x26,"ListFetch data too short");
              goto LAB_0012fd03;
            }
            *(uchar **)(*(long *)(buffer_len + max_keys * 0x38 + 0x30) + _rc * 0x28) =
                 pkey->listFetch_s;
            pkey->listFetch_s =
                 pkey->listFetch_s +
                 *(long *)(*(long *)(buffer_len + max_keys * 0x38 + 0x30) + _rc * 0x28 + 8);
            if (pkey->listFetch_data + pkey->listFetch_data_len < pkey->listFetch_s + 4) {
              _libssh2_error(session_00,-0x26,"ListFetch data too short");
              goto LAB_0012fd03;
            }
            uVar3 = _libssh2_ntohu32(pkey->listFetch_s);
            *(ulong *)(*(long *)(buffer_len + max_keys * 0x38 + 0x30) + _rc * 0x28 + 0x18) =
                 (ulong)uVar3;
            pkey->listFetch_s = pkey->listFetch_s + 4;
            if (pkey->listFetch_data + pkey->listFetch_data_len <
                pkey->listFetch_s +
                *(long *)(*(long *)(buffer_len + max_keys * 0x38 + 0x30) + _rc * 0x28 + 0x18)) {
              _libssh2_error(session_00,-0x26,"ListFetch data too short");
              goto LAB_0012fd03;
            }
            *(uchar **)(*(long *)(buffer_len + max_keys * 0x38 + 0x30) + _rc * 0x28 + 0x10) =
                 pkey->listFetch_s;
            pkey->listFetch_s =
                 pkey->listFetch_s +
                 *(long *)(*(long *)(buffer_len + max_keys * 0x38 + 0x30) + _rc * 0x28 + 0x18);
            *(undefined1 *)(*(long *)(buffer_len + max_keys * 0x38 + 0x30) + _rc * 0x28 + 0x20) = 0;
          }
        }
      }
      *(uchar **)(buffer_len + max_keys * 0x38) = pkey->listFetch_data;
      max_keys = max_keys + 1;
      *(undefined8 *)(buffer_len + max_keys * 0x38) = 0;
      pkey->listFetch_data = (uchar *)0x0;
    }
    else {
      _libssh2_error(session_00,-0x24,"Unexpected publickey subsystem response");
      (*session_00->free)(pkey->listFetch_data,&session_00->abstract);
      pkey->listFetch_data = (uchar *)0x0;
    }
  }
  _libssh2_error(session_00,-0x1e,"Timeout waiting for response from publickey subsystem");
LAB_0012fd03:
  if (pkey->listFetch_data != (uchar *)0x0) {
    (*session_00->free)(pkey->listFetch_data,&session_00->abstract);
    pkey->listFetch_data = (uchar *)0x0;
  }
  if (buffer_len != 0) {
    libssh2_publickey_list_free(pkey,(libssh2_publickey_list *)buffer_len);
  }
  pkey->listFetch_state = libssh2_NB_state_idle;
  return -1;
}

Assistant:

LIBSSH2_API int
libssh2_publickey_list_fetch(LIBSSH2_PUBLICKEY * pkey, unsigned long *num_keys,
                             libssh2_publickey_list ** pkey_list)
{
    LIBSSH2_CHANNEL *channel;
    LIBSSH2_SESSION *session;
    libssh2_publickey_list *list = NULL;
    unsigned long buffer_len = 12, keys = 0, max_keys = 0, i;
    /* 12 = packet_len(4) + list_len(4) + "list"(4) */
    int response;
    int rc;

    if(!pkey)
        return LIBSSH2_ERROR_BAD_USE;

    channel = pkey->channel;
    session = channel->session;

    if(pkey->listFetch_state == libssh2_NB_state_idle) {
        pkey->listFetch_data = NULL;

        pkey->listFetch_s = pkey->listFetch_buffer;
        _libssh2_htonu32(pkey->listFetch_s, (uint32_t)(buffer_len - 4));
        pkey->listFetch_s += 4;
        _libssh2_htonu32(pkey->listFetch_s, sizeof("list") - 1);
        pkey->listFetch_s += 4;
        memcpy(pkey->listFetch_s, "list", sizeof("list") - 1);
        pkey->listFetch_s += sizeof("list") - 1;

        _libssh2_debug((session, LIBSSH2_TRACE_PUBLICKEY,
                       "Sending publickey \"list\" packet"));

        pkey->listFetch_state = libssh2_NB_state_created;
    }

    if(pkey->listFetch_state == libssh2_NB_state_created) {
        ssize_t nwritten;
        nwritten = _libssh2_channel_write(channel, 0,
                                          pkey->listFetch_buffer,
                                          (pkey->listFetch_s -
                                           pkey->listFetch_buffer));
        if(nwritten == LIBSSH2_ERROR_EAGAIN) {
            return (int)nwritten;
        }
        else if((pkey->listFetch_s - pkey->listFetch_buffer) != nwritten) {
            pkey->listFetch_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "Unable to send publickey list packet");
        }

        pkey->listFetch_state = libssh2_NB_state_sent;
    }

    for(;;) {
        rc = publickey_packet_receive(pkey, &pkey->listFetch_data,
                                      &pkey->listFetch_data_len);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            _libssh2_error(session, LIBSSH2_ERROR_SOCKET_TIMEOUT,
                           "Timeout waiting for response from "
                           "publickey subsystem");
            goto err_exit;
        }

        pkey->listFetch_s = pkey->listFetch_data;
        if((response =
             publickey_response_id(&pkey->listFetch_s,
                                   pkey->listFetch_data_len)) < 0) {
            _libssh2_error(session, LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                           "Invalid publickey subsystem response code");
            goto err_exit;
        }

        switch(response) {
        case LIBSSH2_PUBLICKEY_RESPONSE_STATUS:
            /* Error, or processing complete */
        {
            unsigned long status, descr_len, lang_len;

            if(pkey->listFetch_s + 8 <=
               pkey->listFetch_data + pkey->listFetch_data_len) {
                status = _libssh2_ntohu32(pkey->listFetch_s);
                pkey->listFetch_s += 4;
                descr_len = _libssh2_ntohu32(pkey->listFetch_s);
                pkey->listFetch_s += 4;
            }
            else {
                _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                               "ListFetch data too short");
                goto err_exit;
            }

            if(pkey->listFetch_s + descr_len + 4 <=
               pkey->listFetch_data + pkey->listFetch_data_len) {
                /* description starts at pkey->listFetch_s */
                pkey->listFetch_s += descr_len;
                lang_len = _libssh2_ntohu32(pkey->listFetch_s);
                pkey->listFetch_s += 4;
            }
            else {
                _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                               "ListFetch data too short");
                goto err_exit;
            }

            if(pkey->listFetch_s + lang_len <=
               pkey->listFetch_data + pkey->listFetch_data_len) {
                /* lang starts at pkey->listFetch_s */
                pkey->listFetch_s += lang_len;
            }
            else {
                _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                               "ListFetch data too short");
                goto err_exit;
            }

            if(pkey->listFetch_s >
                pkey->listFetch_data + pkey->listFetch_data_len) {
                _libssh2_error(session, LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                               "Malformed publickey subsystem packet");
                goto err_exit;
            }

            if(status == LIBSSH2_PUBLICKEY_SUCCESS) {
                LIBSSH2_FREE(session, pkey->listFetch_data);
                pkey->listFetch_data = NULL;
                *pkey_list = list;
                *num_keys = keys;
                pkey->listFetch_state = libssh2_NB_state_idle;
                return 0;
            }

            publickey_status_error(pkey, session, status);
            goto err_exit;
        }
        case LIBSSH2_PUBLICKEY_RESPONSE_PUBLICKEY:
            /* What we want */
            if(keys >= max_keys) {
                libssh2_publickey_list *newlist;
                /* Grow the key list if necessary */
                max_keys += 8;
                newlist =
                    LIBSSH2_REALLOC(session, list,
                                    (max_keys +
                                     1) * sizeof(libssh2_publickey_list));
                if(!newlist) {
                    _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                   "Unable to allocate memory for "
                                   "publickey list");
                    goto err_exit;
                }
                list = newlist;
            }
            if(pkey->version == 1) {
                unsigned long comment_len;

                if(pkey->listFetch_s + 4 <=
                   pkey->listFetch_data + pkey->listFetch_data_len) {
                    comment_len = _libssh2_ntohu32(pkey->listFetch_s);
                    pkey->listFetch_s += 4;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }

                if(comment_len) {
                    list[keys].num_attrs = 1;
                    list[keys].attrs =
                        LIBSSH2_ALLOC(session,
                                      sizeof(libssh2_publickey_attribute));
                    if(!list[keys].attrs) {
                        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                       "Unable to allocate memory for "
                                       "publickey attributes");
                        goto err_exit;
                    }
                    list[keys].attrs[0].name = "comment";
                    list[keys].attrs[0].name_len = sizeof("comment") - 1;
                    list[keys].attrs[0].value = (char *) pkey->listFetch_s;
                    list[keys].attrs[0].value_len = comment_len;
                    list[keys].attrs[0].mandatory = 0;

                    pkey->listFetch_s += comment_len;
                }
                else {
                    list[keys].num_attrs = 0;
                    list[keys].attrs = NULL;
                }

                if(pkey->listFetch_s + 4 <=
                    pkey->listFetch_data + pkey->listFetch_data_len) {
                    list[keys].name_len = _libssh2_ntohu32(pkey->listFetch_s);
                    pkey->listFetch_s += 4;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }

                if(pkey->listFetch_s + list[keys].name_len <=
                   pkey->listFetch_data + pkey->listFetch_data_len) {
                    list[keys].name = pkey->listFetch_s;
                    pkey->listFetch_s += list[keys].name_len;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }

                if(pkey->listFetch_s + 4 <=
                   pkey->listFetch_data + pkey->listFetch_data_len) {
                    list[keys].blob_len = _libssh2_ntohu32(pkey->listFetch_s);
                    pkey->listFetch_s += 4;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }

                if(pkey->listFetch_s + list[keys].blob_len <=
                   pkey->listFetch_data + pkey->listFetch_data_len) {
                    list[keys].blob = pkey->listFetch_s;
                    pkey->listFetch_s += list[keys].blob_len;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }
            }
            else {
                /* Version == 2 */

                if(pkey->listFetch_s + 4 <=
                   pkey->listFetch_data + pkey->listFetch_data_len) {
                    list[keys].name_len = _libssh2_ntohu32(pkey->listFetch_s);
                    pkey->listFetch_s += 4;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }

                if(pkey->listFetch_s + list[keys].name_len <=
                   pkey->listFetch_data + pkey->listFetch_data_len) {
                    list[keys].name = pkey->listFetch_s;
                    pkey->listFetch_s += list[keys].name_len;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }

                if(pkey->listFetch_s + 4 <=
                   pkey->listFetch_data + pkey->listFetch_data_len) {
                    list[keys].blob_len = _libssh2_ntohu32(pkey->listFetch_s);
                    pkey->listFetch_s += 4;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }

                if(pkey->listFetch_s + list[keys].blob_len <=
                   pkey->listFetch_data + pkey->listFetch_data_len) {
                    list[keys].blob = pkey->listFetch_s;
                    pkey->listFetch_s += list[keys].blob_len;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }

                if(pkey->listFetch_s + 4 <=
                   pkey->listFetch_data + pkey->listFetch_data_len) {
                    list[keys].num_attrs = _libssh2_ntohu32(pkey->listFetch_s);
                    pkey->listFetch_s += 4;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }

                if(list[keys].num_attrs) {
                    list[keys].attrs =
                        LIBSSH2_ALLOC(session,
                                      list[keys].num_attrs *
                                      sizeof(libssh2_publickey_attribute));
                    if(!list[keys].attrs) {
                        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                       "Unable to allocate memory for "
                                       "publickey attributes");
                        goto err_exit;
                    }
                    for(i = 0; i < list[keys].num_attrs; i++) {
                        if(pkey->listFetch_s + 4 <=
                           pkey->listFetch_data + pkey->listFetch_data_len) {
                            list[keys].attrs[i].name_len =
                                _libssh2_ntohu32(pkey->listFetch_s);
                            pkey->listFetch_s += 4;
                        }
                        else {
                            _libssh2_error(session,
                                           LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                           "ListFetch data too short");
                            goto err_exit;
                        }

                        if(pkey->listFetch_s + list[keys].attrs[i].name_len <=
                           pkey->listFetch_data + pkey->listFetch_data_len) {
                            list[keys].attrs[i].name =
                                (char *) pkey->listFetch_s;
                            pkey->listFetch_s += list[keys].attrs[i].name_len;
                        }
                        else {
                            _libssh2_error(session,
                                           LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                           "ListFetch data too short");
                            goto err_exit;
                        }

                        if(pkey->listFetch_s + 4 <=
                           pkey->listFetch_data + pkey->listFetch_data_len) {
                            list[keys].attrs[i].value_len =
                                _libssh2_ntohu32(pkey->listFetch_s);
                            pkey->listFetch_s += 4;
                        }
                        else {
                            _libssh2_error(session,
                                           LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                           "ListFetch data too short");
                            goto err_exit;
                        }

                        if(pkey->listFetch_s +
                           list[keys].attrs[i].value_len <=
                           pkey->listFetch_data + pkey->listFetch_data_len) {
                            list[keys].attrs[i].value =
                                (char *) pkey->listFetch_s;
                            pkey->listFetch_s += list[keys].attrs[i].value_len;
                        }
                        else {
                            _libssh2_error(session,
                                           LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                           "ListFetch data too short");
                            goto err_exit;
                        }

                        /* actually an ignored value */
                        list[keys].attrs[i].mandatory = 0;
                    }
                }
                else {
                    list[keys].attrs = NULL;
                }
            }
            /* To be FREEd in libssh2_publickey_list_free() */
            list[keys].packet = pkey->listFetch_data;
            keys++;

            list[keys].packet = NULL;   /* Terminate the list */
            pkey->listFetch_data = NULL;
            break;
        default:
            /* Unknown/Unexpected */
            _libssh2_error(session, LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                           "Unexpected publickey subsystem response");
            LIBSSH2_FREE(session, pkey->listFetch_data);
            pkey->listFetch_data = NULL;
        }
    }

    /* Only reached via explicit goto */
err_exit:
    if(pkey->listFetch_data) {
        LIBSSH2_FREE(session, pkey->listFetch_data);
        pkey->listFetch_data = NULL;
    }
    if(list) {
        libssh2_publickey_list_free(pkey, list);
    }
    pkey->listFetch_state = libssh2_NB_state_idle;
    return -1;
}